

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  string *psVar1;
  Options *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  CppType CVar4;
  Type i32;
  EnumDescriptor *pEVar5;
  mapped_type *pmVar6;
  Descriptor *pDVar7;
  MessageSCCAnalyzer *options_00;
  FieldDescriptor *field;
  AlphaNum *a;
  Descriptor *descriptor_00;
  FieldDescriptor *d;
  AlphaNum *a_00;
  FieldDescriptor *this_01;
  AlphaNum local_e0;
  allocator local_a9;
  string scope;
  key_type local_88;
  string name;
  key_type local_48;
  
  this->descriptor_ = descriptor;
  (this->type_traits_)._M_dataplus._M_p = (pointer)&(this->type_traits_).field_2;
  (this->type_traits_)._M_string_length = 0;
  psVar1 = &this->type_traits_;
  (this->type_traits_).field_2._M_local_buf[0] = '\0';
  this_00 = &this->options_;
  options_00 = scc_analyzer;
  Options::Options(this_00,options);
  this->scc_analyzer_ = scc_analyzer;
  variables = &this->variables_;
  p_Var2 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = this->descriptor_;
  if ((~(byte)this_01[1] & 0x60) == 0) {
    std::__cxx11::string::assign((char *)psVar1);
    this_01 = this->descriptor_;
  }
  CVar4 = FieldDescriptor::cpp_type(this_01);
  if (CVar4 == CPPTYPE_MESSAGE) {
    std::__cxx11::string::append((char *)psVar1);
    pDVar7 = FieldDescriptor::message_type(this->descriptor_);
    ClassName_abi_cxx11_((string *)&local_e0,(cpp *)pDVar7,(Descriptor *)0x1,SUB81(options_00,0));
    std::__cxx11::string::append((string *)psVar1);
  }
  else {
    if (CVar4 == CPPTYPE_STRING) goto LAB_0030512e;
    if (CVar4 == CPPTYPE_ENUM) {
      std::__cxx11::string::append((char *)psVar1);
      pEVar5 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_
                ((string *)&local_e0,(cpp *)pEVar5,(EnumDescriptor *)0x1,SUB81(options_00,0));
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::append((char *)psVar1);
      pEVar5 = FieldDescriptor::enum_type(this->descriptor_);
      ClassName_abi_cxx11_
                ((string *)&local_e0,(cpp *)pEVar5,(EnumDescriptor *)0x1,SUB81(options_00,0));
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&local_e0);
      goto LAB_0030512e;
    }
    std::__cxx11::string::append((char *)psVar1);
    CVar4 = FieldDescriptor::cpp_type(this->descriptor_);
    PrimitiveTypeName_abi_cxx11_
              ((string *)&local_e0,(cpp *)this_00,(Options *)(ulong)CVar4,(CppType)options_00);
    std::__cxx11::string::append((string *)psVar1);
  }
  std::__cxx11::string::~string((string *)&local_e0);
LAB_0030512e:
  std::__cxx11::string::append((char *)psVar1);
  SetCommonVars(options,variables);
  QualifiedClassName_abi_cxx11_
            ((string *)&local_e0,*(cpp **)(this->descriptor_ + 0x20),(Descriptor *)this_00,
             (Options *)options_00);
  std::__cxx11::string::string((string *)&name,"extendee",(allocator *)&scope);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&name);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"type_traits",(allocator *)&name);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_e0);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&name,*(string **)(this->descriptor_ + 8));
  ResolveKeyword((string *)&local_e0,&name);
  std::__cxx11::string::string((string *)&scope,"name",(allocator *)&local_88);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&scope);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&scope);
  std::__cxx11::string::~string((string *)&local_e0);
  FieldConstantName_abi_cxx11_((string *)&local_e0,(cpp *)this->descriptor_,field);
  std::__cxx11::string::string((string *)&scope,"constant_name",(allocator *)&local_88);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&scope);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&scope);
  std::__cxx11::string::~string((string *)&local_e0);
  i32 = FieldDescriptor::type(this->descriptor_);
  strings::AlphaNum::AlphaNum(&local_e0,i32);
  StrCat_abi_cxx11_(&scope,(protobuf *)&local_e0,a);
  std::__cxx11::string::string((string *)&local_88,"field_type",(allocator *)&local_48);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_88);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&scope);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&scope);
  FieldDescriptor::is_packed(this->descriptor_);
  std::__cxx11::string::string((string *)&local_e0,"packed",(allocator *)&scope);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_e0);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar3 = IsScoped(this);
  if (bVar3) {
    pDVar7 = FieldDescriptor::extension_scope(this->descriptor_);
    ClassName_abi_cxx11_((string *)&local_e0,(cpp *)pDVar7,descriptor_00);
    std::operator+(&scope,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_e0,"::");
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    std::__cxx11::string::string((string *)&scope,"",(allocator *)&local_e0);
  }
  std::__cxx11::string::string((string *)&local_e0,"scope",(allocator *)&local_88);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_e0);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&local_e0);
  ExtensionName_abi_cxx11_((string *)&local_e0,(cpp *)this->descriptor_,d);
  std::__cxx11::string::string((string *)&local_88,"scoped_name",(allocator *)&local_48);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_88);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e0);
  strings::AlphaNum::AlphaNum(&local_e0,*(int *)(this->descriptor_ + 4));
  StrCat_abi_cxx11_(&local_88,(protobuf *)&local_e0,a_00);
  std::__cxx11::string::string((string *)&local_48,"number",&local_a9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_48);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&scope);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options,
                                       MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor), options_(options), scc_analyzer_(scc_analyzer) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(options_, descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
  SetCommonVars(options, &variables_);
  variables_["extendee"] =
      QualifiedClassName(descriptor_->containing_type(), options_);
  variables_["type_traits"] = type_traits_;
  std::string name = descriptor_->name();
  variables_["name"] = ResolveKeyword(name);
  variables_["constant_name"] = FieldConstantName(descriptor_);
  variables_["field_type"] =
      StrCat(static_cast<int>(descriptor_->type()));
  variables_["packed"] = descriptor_->is_packed() ? "true" : "false";

  std::string scope =
      IsScoped() ? ClassName(descriptor_->extension_scope(), false) + "::" : "";
  variables_["scope"] = scope;
  variables_["scoped_name"] = ExtensionName(descriptor_);
  variables_["number"] = StrCat(descriptor_->number());
}